

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.tpl.h
# Opt level: O3

Image<r_code::ImageImpl> * r_code::Image<r_code::ImageImpl>::Read(ifstream *stream)

{
  char cVar1;
  ImageImpl *this;
  long lVar2;
  size_t names_size;
  size_t code_size;
  size_t map_size;
  uint64_t timestamp;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Can\'t read from non-open file",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    this = (ImageImpl *)0x0;
  }
  else {
    std::istream::read((char *)stream,(long)&local_38);
    std::istream::read((char *)stream,(long)&local_40);
    std::istream::read((char *)stream,(long)&local_48);
    std::istream::read((char *)stream,(long)&local_50);
    this = (ImageImpl *)r_code::ImageImpl::operator_new(0x28,local_48 + local_40);
    r_code::ImageImpl::ImageImpl(this,local_38,local_40,local_48,local_50);
    lVar2 = r_code::ImageImpl::data();
    get_size((Image<r_code::ImageImpl> *)this);
    std::istream::read((char *)stream,lVar2);
  }
  return (Image<r_code::ImageImpl> *)this;
}

Assistant:

Image<I> *Image<I>::Read(std::ifstream &stream)
{
    if (!stream.is_open()) {
        std::cerr << "Can't read from non-open file" << std::endl;
        return nullptr;
    }

    uint64_t timestamp;
    size_t map_size;
    size_t code_size;
    size_t names_size;
    stream.read((char *)&timestamp, sizeof(uint64_t));
    stream.read((char *)&map_size, sizeof(size_t));
    stream.read((char *)&code_size, sizeof(size_t));
    stream.read((char *)&names_size, sizeof(size_t));
    Image *image = Build(timestamp, map_size, code_size, names_size);
    stream.read((char *)image->data(), image->get_size() * sizeof(uint32_t));
    return image;
}